

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  const_iterator cVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  FILE *__stream;
  ulong uVar5;
  int i;
  int index;
  char *pcVar6;
  pair<int,_int> *set;
  SetKey *set_00;
  internal iVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  TypeParam ht_in;
  TypeParam ht_out;
  TransparentHasher local_1f0;
  pair<int,_int> local_1e0;
  undefined1 local_1d8 [8];
  undefined8 *local_1d0;
  SetKey local_1c1;
  const_iterator local_1c0;
  undefined1 *local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  const_nonempty_iterator local_150;
  float local_148;
  float local_144;
  undefined1 local_140;
  undefined8 local_120;
  sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
  local_118 [56];
  ulong local_e0;
  undefined **local_d0;
  undefined1 local_c8 [152];
  
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1c0.pos.row_begin._M_current = local_1c0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  local_170._8_8_ =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  set = &local_1e0;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)&local_1c0,(TransparentHasher *)local_1d8,
                     (Identity *)&local_1f0,(SetKey *)set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_170);
  local_d0 = &PTR__BaseHashtableInterface_00c19c08;
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(2000);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  local_c8[0x2a] = true;
  local_c8._60_4_ = pVar4.first;
  local_c8._64_4_ = pVar4.second;
  index = 1;
  do {
    local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)UniqueObjectHelper<std::pair<int,int>>(index);
    google::
    sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_170,
             (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_c8,(value_type *)&local_1c0);
    index = index + 1;
  } while (index != 100);
  local_170._0_8_ = UniqueObjectHelper<std::pair<int,int>>(0x38);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  local_170._0_8_ = UniqueObjectHelper<std::pair<int,int>>(0x16);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  __stream = tmpfile();
  iVar7 = (internal)(__stream != (FILE *)0x0);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0.ht._0_1_ = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,(AssertionResult *)"fp != __null","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((undefined1 *)local_170._0_8_ != local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
    cVar2._M_current = local_1c0.pos.row_begin._M_current;
    if (local_1c0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_1c0.pos.row_begin._M_current)->group !=
          (pointer)&((local_1c0.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
      {
        operator_delete((local_1c0.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar2._M_current);
    }
  }
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  bVar3 = google::
          sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
          ::serialize<ValueSerializer,_IO_FILE>
                    ((sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
                      *)(local_c8 + 0x50));
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,bVar3);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",
               (char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((undefined1 *)local_170._0_8_ != local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
    cVar2._M_current = local_1c0.pos.row_begin._M_current;
    if (local_1c0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_1c0.pos.row_begin._M_current)->group !=
          (pointer)&((local_1c0.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
      {
        operator_delete((local_1c0.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar2._M_current);
    }
  }
  rewind(__stream);
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1f0.super_Hasher.id_ = 0;
  local_1f0.super_Hasher.num_hashes_ = 0;
  local_1f0.super_Hasher.num_compares_ = 0;
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1c0.ht & 0xffffffff00000000);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_170 + 8);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c19c88;
  set_00 = &local_1c1;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_1d8,&local_1f0,(Identity *)&local_1e0,
                     set_00,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1c0);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c19c08;
  local_1d0 = (undefined8 *)0x0;
  local_1d8[0] = iVar7;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1d8,(AssertionResult *)"fp != __null","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((pair<int,_int>)local_1f0.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_120 = 0;
  local_1d8[0] = (internal)
                 google::
                 sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
                 ::unserialize<ValueSerializer,_IO_FILE>(local_118,__stream);
  local_148 = local_148 * (float)local_e0;
  uVar5 = (ulong)local_148;
  local_160._8_8_ = (long)(local_148 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_144 = (float)local_e0 * local_144;
  uVar5 = (ulong)local_144;
  local_150 = (const_nonempty_iterator)
              ((long)(local_144 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
  local_140 = 0;
  local_1d0 = (undefined8 *)0x0;
  if (!(bool)local_1d8[0]) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1d8,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",
               (char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((pair<int,_int>)local_1f0.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  fclose(__stream);
  local_1f0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(1);
  local_1e0 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1d8,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<int,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                  + 8))();
    }
  }
  puVar1 = local_1d0;
  if (local_1d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
      operator_delete((undefined8 *)*local_1d0);
    }
    operator_delete(puVar1);
  }
  local_1f0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(99);
  local_1e0 = UniqueObjectHelper<std::pair<int,int>>(99);
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1d8,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<int,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                  + 8))();
    }
  }
  puVar1 = local_1d0;
  if (local_1d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
      operator_delete((undefined8 *)*local_1d0);
    }
    operator_delete(puVar1);
  }
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<std::pair<int,int>>(100);
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  bVar3 = pVar8.first == 0xffffffffffffffff;
  local_1d8[0] = (internal)bVar3;
  local_1d0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1d8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)set_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((pair<int,_int>)local_1f0.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_1f0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(0x15);
  local_1e0 = UniqueObjectHelper<std::pair<int,int>>(0x15);
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1d8,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<int,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((pair<int,_int>)local_1c0.ht != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1c0.ht + 8))();
    }
  }
  puVar1 = local_1d0;
  if (local_1d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
      operator_delete((undefined8 *)*local_1d0);
    }
    operator_delete(puVar1);
  }
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<std::pair<int,int>>(0x16);
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  iVar7 = (internal)(pVar8.first == 0xffffffffffffffff);
  local_1d0 = (undefined8 *)0x0;
  local_1d8[0] = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1d8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((pair<int,_int>)local_1f0.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_1c0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<std::pair<int,int>>(0x38);
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  local_1d8[0] = (internal)(pVar8.first == 0xffffffffffffffff);
  local_1d0 = (undefined8 *)0x0;
  if (!(bool)local_1d8[0]) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1d8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1c0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((pair<int,_int>)local_1f0.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_118);
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c8 + 0x50));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}